

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ExpandDimsLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_expanddims(NeuralNetworkLayer *this)

{
  bool bVar1;
  ExpandDimsLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_expanddims(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_expanddims(this);
    this_00 = (ExpandDimsLayerParams *)operator_new(0x28);
    ExpandDimsLayerParams::ExpandDimsLayerParams(this_00);
    (this->layer_).expanddims_ = this_00;
  }
  return (ExpandDimsLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ExpandDimsLayerParams* NeuralNetworkLayer::mutable_expanddims() {
  if (!has_expanddims()) {
    clear_layer();
    set_has_expanddims();
    layer_.expanddims_ = new ::CoreML::Specification::ExpandDimsLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.expandDims)
  return layer_.expanddims_;
}